

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::MatteMaterial__eval
                 (ISPCMatteMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,Vec3fa *wi)

{
  Vec3fa *in_RCX;
  long in_RSI;
  embree *in_RDI;
  DifferentialGeometry *in_R8;
  Vec3fa *in_R9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Lambertian lambertian;
  Lambertian local_58;
  Vec3fa *local_40;
  DifferentialGeometry *local_38;
  Vec3fa *local_30;
  undefined8 *local_10;
  undefined1 *local_8;
  
  local_10 = (undefined8 *)(in_RSI + 0x10);
  local_8 = &stack0xffffffffffffff98;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  make_Lambertian((Vec3fa *)*local_10);
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
          Lambertian__eval(in_RDI,&local_58,local_30,local_38,local_40);
  return (Vec3fa)aVar1;
}

Assistant:

Vec3fa MatteMaterial__eval(ISPCMatteMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Lambertian lambertian = make_Lambertian(Vec3fa((Vec3fa)This->reflectance));
  return Lambertian__eval(&lambertian,wo,dg,wi);
}